

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O2

void e2e_fdb_del_person(storage_t *st,person_t *p)

{
  char *__s;
  fdb_kvs_handle *pfVar1;
  checkpoint_t *pcVar2;
  bool bVar3;
  fdb_status fVar4;
  fdb_status fVar5;
  size_t sVar6;
  fdb_doc *local_40;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  local_40 = (fdb_doc *)0x0;
  sVar6 = strlen(p->key);
  fdb_doc_create(&local_40,p,sVar6,(void *)0x0,0,(void *)0x0,0);
  fVar4 = fdb_get(st->all_docs,local_40);
  fVar5 = fdb_del(st->all_docs,local_40);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
            ,0x104);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                  ,0x104,"void e2e_fdb_del_person(storage_t *, person_t *)");
  }
  pfVar1 = st->index1;
  __s = p->name;
  sVar6 = strlen(__s);
  fVar5 = fdb_del_kv(pfVar1,__s,sVar6);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfVar1 = st->index2;
    sVar6 = strlen(__s);
    fVar5 = fdb_del_kv(pfVar1,__s,sVar6);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      save_tx(st,local_40->key,local_40->keylen,2);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        bVar3 = is_indexed(st->index_params,p);
        pcVar2 = st->v_chk;
        if (bVar3) {
          pcVar2->num_indexed = pcVar2->num_indexed + -1;
          pcVar2->sum_age_indexed = pcVar2->sum_age_indexed - p->age;
        }
        pcVar2->ndocs = pcVar2->ndocs + -1;
      }
      fdb_doc_free(local_40);
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
            ,0x10c);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                  ,0x10c,"void e2e_fdb_del_person(storage_t *, person_t *)");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
          ,0x108);
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                ,0x108,"void e2e_fdb_del_person(storage_t *, person_t *)");
}

Assistant:

void e2e_fdb_del_person(storage_t *st, person_t *p){
    TEST_INIT();

    fdb_status status;
    fdb_doc *doc = NULL;
    bool indexed;
    bool existed;

    fdb_doc_create(&doc, p->key, strlen(p->key), NULL, 0, NULL, 0);

    status = fdb_get(st->all_docs, doc);
    existed = (status == FDB_RESULT_SUCCESS);

    // main person.key -> person doc
    status = fdb_del(st->all_docs, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person doc
    status = fdb_del_kv(st->index1, p->name, strlen(p->name));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person age
    status = fdb_del_kv(st->index2, p->name, strlen(p->name));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update transaction db
    save_tx(st, doc->key, doc->keylen, DEL_PERSON);

    if(existed){ // check if was indexed
        indexed = is_indexed(st->index_params, p);
        if(indexed){  // within storage index
            // update verification checkpoint
            st->v_chk->num_indexed--;
            st->v_chk->sum_age_indexed-=p->age;
        }
        st->v_chk->ndocs -= 1;
    }

    fdb_doc_free(doc);
    doc=NULL;

}